

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O0

KBOOL __thiscall KDIS::DATA_TYPE::Mine::operator==(Mine *this,Mine *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Mine *Value_local;
  Mine *this_local;
  
  KVar1 = Vector::operator!=(&this->m_Loc,&Value->m_Loc);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui16ID == Value->m_ui16ID) {
    if (((float)this->m_f32GrndOffset != (float)Value->m_f32GrndOffset) ||
       (NAN((float)this->m_f32GrndOffset) || NAN((float)Value->m_f32GrndOffset))) {
      this_local._7_1_ = false;
    }
    else if (((float)this->m_f32WtrOffset != (float)Value->m_f32WtrOffset) ||
            (NAN((float)this->m_f32WtrOffset) || NAN((float)Value->m_f32WtrOffset))) {
      this_local._7_1_ = false;
    }
    else if (((float)this->m_f32SnwOffset != (float)Value->m_f32SnwOffset) ||
            (NAN((float)this->m_f32SnwOffset) || NAN((float)Value->m_f32SnwOffset))) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else if (((float)this->m_f32ThrmCont != (float)Value->m_f32ThrmCont) ||
              (NAN((float)this->m_f32ThrmCont) || NAN((float)Value->m_f32ThrmCont))) {
        this_local._7_1_ = false;
      }
      else if (((float)this->m_f32Rflt != (float)Value->m_f32Rflt) ||
              (NAN((float)this->m_f32Rflt) || NAN((float)Value->m_f32Rflt))) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = ClockTime::operator!=(&this->m_MET,&Value->m_MET);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = MineFusing::operator!=(&this->m_MF,&Value->m_MF);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            bVar2 = std::operator!=(&this->m_vui8SDC,&Value->m_vui8SDC);
            if (bVar2) {
              this_local._7_1_ = false;
            }
            else {
              KVar1 = MinePaintScheme::operator!=(&this->m_MPS,&Value->m_MPS);
              if (KVar1) {
                this_local._7_1_ = false;
              }
              else if (this->m_ui8NumTrpDetWrs == Value->m_ui8NumTrpDetWrs) {
                bVar2 = std::operator!=(&this->m_mvVertices,&Value->m_mvVertices);
                if (bVar2) {
                  this_local._7_1_ = false;
                }
                else {
                  this_local._7_1_ = true;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
          }
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Mine::operator == ( const Mine & Value ) const
{
    if( m_Loc               != Value.m_Loc )            return false;
    if( m_ui16ID            != Value.m_ui16ID )         return false;
    if( m_f32GrndOffset     != Value.m_f32GrndOffset )  return false;
    if( m_f32WtrOffset      != Value.m_f32WtrOffset )   return false;
    if( m_f32SnwOffset      != Value.m_f32SnwOffset )   return false;
    if( m_Ori               != Value.m_Ori )            return false;
    if( m_f32ThrmCont       != Value.m_f32ThrmCont )    return false;
    if( m_f32Rflt           != Value.m_f32Rflt )        return false;
    if( m_MET               != Value.m_MET )            return false;
    if( m_MF                != Value.m_MF )             return false;
    if( m_vui8SDC           != Value.m_vui8SDC )        return false;
    if( m_MPS               != Value.m_MPS )            return false;
    if( m_ui8NumTrpDetWrs   != Value.m_ui8NumTrpDetWrs )return false;
    if( m_mvVertices        != Value.m_mvVertices )     return false;
    return true;
}